

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseActionCommand(WastParser *this,CommandPtr *out_command)

{
  Command *pCVar1;
  Command *pCVar2;
  Result RVar3;
  Enum EVar4;
  Command *local_20;
  
  pCVar2 = local_20;
  MakeUnique<wabt::ActionCommandBase<(wabt::CommandType)1>>();
  RVar3 = ParseAction(this,(ActionPtr *)(local_20 + 1));
  if (RVar3.enum_ == Error) {
    EVar4 = Error;
  }
  else {
    local_20 = (Command *)0x0;
    pCVar1 = (out_command->_M_t).
             super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
             super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
             super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl;
    (out_command->_M_t).super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
    _M_t.super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
    super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl = pCVar2;
    if (pCVar1 == (Command *)0x0) {
      return (Result)Ok;
    }
    (*pCVar1->_vptr_Command[1])();
    EVar4 = Ok;
  }
  if (local_20 != (Command *)0x0) {
    (*local_20->_vptr_Command[1])();
  }
  return (Result)EVar4;
}

Assistant:

Result WastParser::ParseActionCommand(CommandPtr* out_command) {
  WABT_TRACE(ParseActionCommand);
  auto command = MakeUnique<ActionCommand>();
  CHECK_RESULT(ParseAction(&command->action));
  *out_command = std::move(command);
  return Result::Ok;
}